

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgtool.c
# Opt level: O3

void nt(LispPTR index)

{
  fnhead *fnobj;
  uint uVar1;
  long lVar2;
  DLword **ppDVar3;
  ulong uVar4;
  
  if ((index & 0xfff0000) == 0) {
    ppDVar3 = &AtomSpace;
    lVar2 = (ulong)(index * 5) << 2;
  }
  else {
    if ((index & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)index);
    }
    ppDVar3 = &Lisp_world;
    lVar2 = (ulong)index * 2;
  }
  uVar1 = *(uint *)((long)*ppDVar3 + lVar2 + 8);
  uVar4 = (ulong)(uVar1 & 0xfffffff);
  if ((uVar1 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar4);
  }
  fnobj = (fnhead *)(Lisp_world + uVar4);
  if ((*(uint *)(Lisp_world + uVar4 + 4) & 0xfffffff) == index) {
    printf("***DUMP Func Header << ");
    if (((ulong)fnobj & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",fnobj);
    }
    printf("start at 0x%x lisp address(%p 68k)\n",(ulong)((long)fnobj - (long)Lisp_world) >> 1,fnobj
          );
    print(index);
    putchar(10);
    ntheader(fnobj);
    return;
  }
  printf("DEFCELL says it is ");
  print_atomname(index);
  printf("\n But Func OBJ says ");
  print_atomname(*(uint *)&fnobj->field_0x8 & 0xfffffff);
  putchar(10);
  return;
}

Assistant:

void nt(LispPTR index)
/* atom index */
{
  struct fnhead *fnobj;
  DefCell *defcell68k;

  defcell68k = (DefCell *)GetDEFCELL68k(index);
  fnobj = (struct fnhead *)NativeAligned4FromLAddr(defcell68k->defpointer);

  /* check if it's the same index ??*/
  if (index != (fnobj->framename)) {
    printf("DEFCELL says it is ");
    print_atomname(index);
    printf("\n But Func OBJ says ");
    print_atomname(fnobj->framename);
    putchar('\n');
    return;
  }

  printf("***DUMP Func Header << ");
  printf("start at 0x%x lisp address(%p 68k)\n", LAddrFromNative(fnobj), (void *)fnobj);
  print(index);
  putchar('\n');

  ntheader(fnobj);
}